

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Stmt * __thiscall parser::Parser::parseStatement(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  FunctionStmt *pFVar3;
  ForRangeStmt *pFVar4;
  DeclareStmt *pDVar5;
  ReturnStmt *pRVar6;
  InitStmt *pIVar7;
  IfStmt *pIVar8;
  ExpressionStmt *pEVar9;
  Stmt *pSVar10;
  Expr *pEVar11;
  long *plStack_40;
  long lStack_38;
  long alStack_30 [2];
  
  switch((this->curToken).Type) {
  case DEFINE:
    if ((this->peekToken).Type != LBRACE) {
      pFVar3 = parseFunctionStatement(this);
      return (Stmt *)pFVar3;
    }
    break;
  case INIT:
    pIVar7 = parseInitStatement(this);
    return &pIVar7->super_Stmt;
  case DECLARE:
    pDVar5 = parseDeclStatement(this);
    return &pDVar5->super_Stmt;
  case FUNCTION:
  case EOB:
  case INVALID:
  case LBRACE:
  case RBRACE:
  case LPAREN:
  case RPAREN:
  case ELSE:
    pEVar9 = parseExpressionStatement(this);
    return &pEVar9->super_Stmt;
  case NEWLINE:
    return (Stmt *)0x0;
  case IF:
    pIVar8 = parseIfStatement(this);
    return &pIVar8->super_Stmt;
  case FOR:
    pFVar4 = parseForIntRangeStatement(this);
    return &pFVar4->super_Stmt;
  case RETURN:
    pRVar6 = parseReturnStatement(this);
    return &pRVar6->super_Stmt;
  }
  pSVar10 = (Stmt *)operator_new(0x48);
  TVar1 = (this->curToken).Type;
  pcVar2 = (this->curToken).Literal._M_dataplus._M_p;
  plStack_40 = alStack_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_40,pcVar2,pcVar2 + (this->curToken).Literal._M_string_length);
  (pSVar10->super_Node).lineno = this->l->line;
  (pSVar10->super_Node).type_value = ExpressionStmtType;
  (pSVar10->super_Node)._vptr_Node = (_func_int **)&PTR__ExpressionStmt_00179770;
  pSVar10[1].super_Node._vptr_Node = (_func_int **)&PTR__Token_001788e0;
  pSVar10[1].super_Node.lineno = TVar1;
  pSVar10[2].super_Node._vptr_Node = (_func_int **)(pSVar10 + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pSVar10 + 2),plStack_40,lStack_38 + (long)plStack_40);
  pSVar10[4].super_Node._vptr_Node = (_func_int **)0x0;
  if (plStack_40 != alStack_30) {
    operator_delete(plStack_40,alStack_30[0] + 1);
  }
  pEVar11 = parseExpression(this);
  pSVar10[4].super_Node._vptr_Node = (_func_int **)pEVar11;
  if (pEVar11 == (Expr *)0x0) {
    (*(pSVar10->super_Node)._vptr_Node[1])(pSVar10);
    pSVar10 = (Stmt *)0x0;
  }
  return pSVar10;
}

Assistant:

Stmt* Parser::parseStatement()
{
    switch (curToken.Type) {
       case TokenType::IF:
           return parseIfStatement();
       case TokenType::FOR:
           return parseForIntRangeStatement();
       case TokenType::DECLARE:
           return parseDeclStatement();
       case TokenType::INIT:
           return parseInitStatement();
       case TokenType::DEFINE:
           if(peekTokenIs(TokenType::LBRACE)){
               return parseExpressionStatement();
           }
           return parseFunctionStatement();
       case TokenType::RETURN:
            return parseReturnStatement();
       case TokenType::NEWLINE:
             return nullptr;
       default:
           return parseExpressionStatement();
    }
}